

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

void Diligent::FormatStrSS<std::__cxx11::stringstream,char*>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char **Arg)

{
  std::operator<<((ostream *)(ss + 0x10),*Arg);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const ArgType& Arg)
{
    ss << Arg;
}